

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_graphics_pipeline
          (Impl *this,VkGraphicsPipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkGraphicsPipelineCreateInfo **out_create_info)

{
  VkPipelineColorBlendStateCreateInfo *pVVar1;
  VkPipelineVertexInputStateCreateInfo *pVVar2;
  VkPipelineViewportStateCreateInfo *pVVar3;
  VkPipelineMultisampleStateCreateInfo *pVVar4;
  bool bVar5;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  VkGraphicsPipelineCreateInfo *info;
  ulong uVar6;
  VkPipelineCreateFlags2CreateInfo *pVVar7;
  VkPipelineColorBlendAttachmentState *pVVar8;
  VkVertexInputAttributeDescription *pVVar9;
  VkVertexInputBindingDescription *pVVar10;
  VkViewport *pVVar11;
  VkRect2D *pVVar12;
  uint *puVar13;
  VkPipeline pVVar14;
  uint uVar15;
  VkGraphicsPipelineCreateInfo *create_info_00;
  VkPipelineColorBlendStateCreateInfo *blend;
  long *in_FS_OFFSET;
  GlobalStateInfo GVar16;
  SubpassMeta subpass_meta;
  DynamicStateInfo dynamic_info;
  VkPipelineColorBlendStateCreateInfo *local_70;
  VkPipelineDynamicStateCreateInfo *pVStack_68;
  VkPipelineLayout local_60;
  VkRenderPass pVStack_58;
  bool local_50;
  bool bStack_4f;
  bool bStack_4e;
  bool bStack_4d;
  bool bStack_4c;
  bool bStack_4b;
  bool bStack_4a;
  bool bStack_49;
  VkPipeline pVStack_48;
  bool local_40;
  bool bStack_3f;
  bool bStack_3e;
  bool bStack_3d;
  bool bStack_3c;
  bool bStack_3b;
  bool bStack_3a;
  bool bStack_39;
  bool bStack_38;
  bool bStack_37;
  bool bStack_36;
  bool bStack_35;
  bool bStack_34;
  bool bStack_33;
  bool bStack_32;
  bool bStack_31;
  
  info = copy<VkGraphicsPipelineCreateInfo>(this,create_info,1,alloc);
  subpass_meta.uses_color = true;
  subpass_meta.uses_depth_stencil = true;
  dynamic_info.color_blend_advanced = false;
  dynamic_info.provoking_vertex_mode = false;
  dynamic_info.line_rasterization_mode = false;
  dynamic_info.line_stipple_enable = false;
  dynamic_info.depth_clip_negative_one_to_one = false;
  dynamic_info.viewport_w_scaling_enable = false;
  dynamic_info.viewport_swizzle = false;
  dynamic_info.coverage_to_color_enable = false;
  dynamic_info.coverage_to_color_location = false;
  dynamic_info.coverage_modulation_mode = false;
  dynamic_info.coverage_modulation_table_enable = false;
  dynamic_info.coverage_modulation_table = false;
  dynamic_info.shading_rate_image_enable = false;
  dynamic_info.representative_fragment_test_enable = false;
  dynamic_info.coverage_reduction_mode = false;
  dynamic_info.depth_clamp_range = false;
  dynamic_info.tessellation_domain_origin = false;
  dynamic_info.depth_clamp_enable = false;
  dynamic_info.polygon_mode = false;
  dynamic_info.rasterization_samples = false;
  dynamic_info.sample_mask = false;
  dynamic_info.alpha_to_coverage_enable = false;
  dynamic_info.alpha_to_one_enable = false;
  dynamic_info.logic_op_enable = false;
  dynamic_info.color_blend_enable = false;
  dynamic_info.color_blend_equation = false;
  dynamic_info.color_write_mask = false;
  dynamic_info.rasterization_stream = false;
  dynamic_info.conservative_rasterization_mode = false;
  dynamic_info.extra_primitive_overestimation_size = false;
  dynamic_info.depth_clip_enable = false;
  dynamic_info.sample_locations_enable = false;
  dynamic_info.depth_bounds_test_enable = false;
  dynamic_info.stencil_test_enable = false;
  dynamic_info.stencil_op = false;
  dynamic_info.vertex_input = false;
  dynamic_info.vertex_input_binding_stride = false;
  dynamic_info.patch_control_points = false;
  dynamic_info.rasterizer_discard_enable = false;
  dynamic_info.primitive_restart_enable = false;
  dynamic_info.logic_op = false;
  dynamic_info.color_write_enable = false;
  dynamic_info.depth_bias_enable = false;
  dynamic_info.discard_rectangle = false;
  dynamic_info.discard_rectangle_mode = false;
  dynamic_info.fragment_shading_rate = false;
  dynamic_info.sample_locations = false;
  dynamic_info.line_stipple = false;
  dynamic_info.stencil_compare = false;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  dynamic_info.viewport = false;
  dynamic_info.scissor_count = false;
  dynamic_info.viewport_count = false;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = false;
  dynamic_info.depth_compare_op = false;
  if (create_info->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    Hashing::parse_dynamic_state_info((DynamicStateInfo *)&local_70,create_info->pDynamicState);
    dynamic_info.color_blend_advanced = local_40;
    dynamic_info.provoking_vertex_mode = bStack_3f;
    dynamic_info.line_rasterization_mode = bStack_3e;
    dynamic_info.line_stipple_enable = bStack_3d;
    dynamic_info.depth_clip_negative_one_to_one = bStack_3c;
    dynamic_info.viewport_w_scaling_enable = bStack_3b;
    dynamic_info.viewport_swizzle = bStack_3a;
    dynamic_info.coverage_to_color_enable = bStack_39;
    dynamic_info.coverage_to_color_location = bStack_38;
    dynamic_info.coverage_modulation_mode = bStack_37;
    dynamic_info.coverage_modulation_table_enable = bStack_36;
    dynamic_info.coverage_modulation_table = bStack_35;
    dynamic_info.shading_rate_image_enable = bStack_34;
    dynamic_info.representative_fragment_test_enable = bStack_33;
    dynamic_info.coverage_reduction_mode = bStack_32;
    dynamic_info.depth_clamp_range = bStack_31;
    dynamic_info.tessellation_domain_origin = local_50;
    dynamic_info.depth_clamp_enable = bStack_4f;
    dynamic_info.polygon_mode = bStack_4e;
    dynamic_info.rasterization_samples = bStack_4d;
    dynamic_info.sample_mask = bStack_4c;
    dynamic_info.alpha_to_coverage_enable = bStack_4b;
    dynamic_info.alpha_to_one_enable = bStack_4a;
    dynamic_info.logic_op_enable = bStack_49;
    dynamic_info._40_8_ = pVStack_48;
    dynamic_info._16_8_ = local_60;
    dynamic_info._24_8_ = pVStack_58;
    dynamic_info._0_8_ = local_70;
    dynamic_info._8_8_ = pVStack_68;
  }
  create_info_00 = (VkGraphicsPipelineCreateInfo *)&dynamic_info;
  GVar16 = Hashing::parse_global_state_info
                     (create_info,(DynamicStateInfo *)create_info_00,&subpass_meta);
  uVar6 = GVar16._0_8_;
  state_flags = graphics_pipeline_get_effective_state_flags((Fossilize *)info,create_info_00);
  if (((undefined1  [11])GVar16 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    info->pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  }
  if ((uVar6 >> 0x30 & 1) == 0) {
    info->pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)0x0;
  }
  if ((uVar6 >> 0x20 & 1) == 0) {
    info->pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  }
  if ((uVar6 >> 0x28 & 1) == 0) {
    info->pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  }
  uVar15 = GVar16._0_4_;
  if ((uVar15 >> 8 & 1) == 0) {
    info->pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  if ((uVar15 >> 0x10 & 1) == 0) {
    info->pViewportState = (VkPipelineViewportStateCreateInfo *)0x0;
  }
  if ((uVar15 >> 0x18 & 1) == 0) {
    info->pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)0x0;
  }
  if ((uVar6 >> 0x38 & 1) == 0) {
    info->pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar16 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    info->renderPass = (VkRenderPass)0x0;
    info->subpass = 0;
  }
  if ((GVar16._8_3_ >> 8 & 1) == 0) {
    info->layout = (VkPipelineLayout)0x0;
  }
  uVar15 = info->flags & 0x7ffffc3f;
  info->flags = uVar15;
  pVVar7 = find_pnext<VkPipelineCreateFlags2CreateInfo>((VkStructureType)info->pNext,create_info_00)
  ;
  pVVar14 = (VkPipeline)0x0;
  if (pVVar7 != (VkPipelineCreateFlags2CreateInfo *)0x0) {
    uVar15 = 0;
  }
  info->flags = uVar15;
  if ((uVar15 & 4) != 0) {
    if (info->basePipelineHandle != (VkPipeline)0x0) goto LAB_00113ed7;
    uVar15 = info->basePipelineIndex;
    if ((long)(int)uVar15 < 0) goto LAB_00113ed7;
    if (base_pipeline_count <= uVar15) {
      if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar5 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
      if (!bVar5) {
        fwrite("Fossilize ERROR: Base pipeline index is out of range.\n",0x36,1,_stderr);
        return false;
      }
      return false;
    }
    pVVar14 = base_pipelines[(int)uVar15];
  }
  info->basePipelineHandle = pVVar14;
LAB_00113ed7:
  info->basePipelineIndex = -1;
  bVar5 = copy_sub_create_info<VkPipelineTessellationStateCreateInfo>
                    (this,&info->pTessellationState,alloc,&dynamic_info,state_flags);
  if (bVar5) {
    bVar5 = copy_sub_create_info<VkPipelineColorBlendStateCreateInfo>
                      (this,&info->pColorBlendState,alloc,&dynamic_info,state_flags);
    if (bVar5) {
      bVar5 = copy_sub_create_info<VkPipelineVertexInputStateCreateInfo>
                        (this,&info->pVertexInputState,alloc,&dynamic_info,state_flags);
      if (bVar5) {
        bVar5 = copy_sub_create_info<VkPipelineMultisampleStateCreateInfo>
                          (this,&info->pMultisampleState,alloc,&dynamic_info,state_flags);
        if (bVar5) {
          bVar5 = copy_sub_create_info<VkPipelineViewportStateCreateInfo>
                            (this,&info->pViewportState,alloc,&dynamic_info,state_flags);
          if ((((bVar5) &&
               (bVar5 = copy_sub_create_info<VkPipelineInputAssemblyStateCreateInfo>
                                  (this,&info->pInputAssemblyState,alloc,&dynamic_info,state_flags),
               bVar5)) &&
              (bVar5 = copy_sub_create_info<VkPipelineDepthStencilStateCreateInfo>
                                 (this,&info->pDepthStencilState,alloc,&dynamic_info,state_flags),
              bVar5)) &&
             (bVar5 = copy_sub_create_info<VkPipelineRasterizationStateCreateInfo>
                                (this,&info->pRasterizationState,alloc,&dynamic_info,state_flags),
             bVar5)) {
            if ((GVar16._8_3_ >> 0x10 & 1) == 0) {
              info->stageCount = 0;
              info->pStages = (VkPipelineShaderStageCreateInfo *)0x0;
            }
            else {
              bVar5 = copy_stages<VkGraphicsPipelineCreateInfo>
                                (this,info,alloc,device,gsmcii,&dynamic_info);
              if (!bVar5) {
                return false;
              }
            }
            bVar5 = copy_dynamic_state<VkGraphicsPipelineCreateInfo>(this,info,alloc,&dynamic_info);
            if (bVar5) {
              pVVar1 = info->pColorBlendState;
              if (pVVar1 != (VkPipelineColorBlendStateCreateInfo *)0x0) {
                if (((dynamic_info.color_blend_enable == true) &&
                    (dynamic_info.color_write_mask == true)) &&
                   (dynamic_info.color_blend_equation == true)) {
                  pVVar1->pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
                }
                else {
                  pVVar8 = copy<VkPipelineColorBlendAttachmentState>
                                     (this,pVVar1->pAttachments,(ulong)pVVar1->attachmentCount,alloc
                                     );
                  pVVar1->pAttachments = pVVar8;
                }
              }
              pVVar2 = info->pVertexInputState;
              if (pVVar2 != (VkPipelineVertexInputStateCreateInfo *)0x0) {
                pVVar9 = copy<VkVertexInputAttributeDescription>
                                   (this,pVVar2->pVertexAttributeDescriptions,
                                    (ulong)pVVar2->vertexAttributeDescriptionCount,alloc);
                pVVar2->pVertexAttributeDescriptions = pVVar9;
                pVVar10 = copy<VkVertexInputBindingDescription>
                                    (this,pVVar2->pVertexBindingDescriptions,
                                     (ulong)pVVar2->vertexBindingDescriptionCount,alloc);
                pVVar2->pVertexBindingDescriptions = pVVar10;
              }
              pVVar3 = info->pViewportState;
              if (pVVar3 != (VkPipelineViewportStateCreateInfo *)0x0) {
                if (pVVar3->pViewports != (VkViewport *)0x0) {
                  pVVar11 = copy<VkViewport>(this,pVVar3->pViewports,(ulong)pVVar3->viewportCount,
                                             alloc);
                  pVVar3->pViewports = pVVar11;
                }
                if (pVVar3->pScissors != (VkRect2D *)0x0) {
                  pVVar12 = copy<VkRect2D>(this,pVVar3->pScissors,(ulong)pVVar3->scissorCount,alloc)
                  ;
                  pVVar3->pScissors = pVVar12;
                }
              }
              pVVar4 = info->pMultisampleState;
              if (pVVar4 != (VkPipelineMultisampleStateCreateInfo *)0x0) {
                if (dynamic_info.sample_mask == true) {
                  pVVar4->pSampleMask = (VkSampleMask *)0x0;
                }
                else if (pVVar4->pSampleMask != (uint *)0x0) {
                  puVar13 = copy<unsigned_int>(this,pVVar4->pSampleMask,
                                               (long)((int)(pVVar4->rasterizationSamples +
                                                           (VK_SAMPLE_COUNT_16_BIT|
                                                            VK_SAMPLE_COUNT_8_BIT|
                                                            VK_SAMPLE_COUNT_4_BIT|
                                                            VK_SAMPLE_COUNT_2_BIT|
                                                           VK_SAMPLE_COUNT_1_BIT)) / 0x20),alloc);
                  pVVar4->pSampleMask = puVar13;
                }
              }
              bVar5 = copy_pnext_chain(this,info->pNext,alloc,&info->pNext,&dynamic_info,state_flags
                                      );
              if (bVar5) {
                *out_create_info = info;
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_graphics_pipeline(const VkGraphicsPipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                 const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                 VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                 VkGraphicsPipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);

	// At the time of copy we don't really know the subpass meta state since the render pass is still being
	// parsed in a thread.
	// Assume that the subpass uses color or depth when copying.
	// This could in theory break if app passes pointer to invalid data while taking advantage of this
	// rule, but it has never happened so far ...
	const SubpassMeta subpass_meta = { true, true };

	DynamicStateInfo dynamic_info = {};
	if (create_info->pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*create_info->pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(*create_info, dynamic_info, subpass_meta);
	auto state_flags = graphics_pipeline_get_effective_state_flags(*info);

	// Remove pointers which a driver must ignore depending on other state.
	if (!global_info.input_assembly)
		info->pInputAssemblyState = nullptr;
	if (!global_info.vertex_input)
		info->pVertexInputState = nullptr;
	if (!global_info.depth_stencil_state)
		info->pDepthStencilState = nullptr;
	if (!global_info.color_blend_state)
		info->pColorBlendState = nullptr;
	if (!global_info.tessellation_state)
		info->pTessellationState = nullptr;
	if (!global_info.viewport_state)
		info->pViewportState = nullptr;
	if (!global_info.multisample_state)
		info->pMultisampleState = nullptr;
	if (!global_info.rasterization_state)
		info->pRasterizationState = nullptr;

	// If we can ignore render pass state, do just that.
	if (!global_info.render_pass_state)
	{
		info->renderPass = VK_NULL_HANDLE;
		info->subpass = 0;
	}

	if (!global_info.layout_state)
		info->layout = VK_NULL_HANDLE;

	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_sub_create_info(info->pTessellationState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pColorBlendState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pVertexInputState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pMultisampleState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pViewportState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pInputAssemblyState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pDepthStencilState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pRasterizationState, alloc, &dynamic_info, state_flags))
		return false;

	if (global_info.module_state)
	{
		if (!copy_stages(info, alloc, device, gsmcii, &dynamic_info))
			return false;
	}
	else
	{
		info->stageCount = 0;
		info->pStages = nullptr;
	}

	if (!copy_dynamic_state(info, alloc, &dynamic_info))
		return false;

	if (info->pColorBlendState)
	{
		auto &blend = const_cast<VkPipelineColorBlendStateCreateInfo &>(*info->pColorBlendState);

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
			blend.pAttachments = nullptr;
		else
			blend.pAttachments = copy(blend.pAttachments, blend.attachmentCount, alloc);
	}

	if (info->pVertexInputState)
	{
		auto &vs = const_cast<VkPipelineVertexInputStateCreateInfo &>(*info->pVertexInputState);
		vs.pVertexAttributeDescriptions = copy(vs.pVertexAttributeDescriptions, vs.vertexAttributeDescriptionCount, alloc);
		vs.pVertexBindingDescriptions = copy(vs.pVertexBindingDescriptions, vs.vertexBindingDescriptionCount, alloc);
	}

	if (info->pViewportState)
	{
		auto &vp = const_cast<VkPipelineViewportStateCreateInfo &>(*info->pViewportState);
		if (vp.pViewports)
			vp.pViewports = copy(vp.pViewports, vp.viewportCount, alloc);
		if (vp.pScissors)
			vp.pScissors = copy(vp.pScissors, vp.scissorCount, alloc);
	}

	if (info->pMultisampleState)
	{
		auto &ms = const_cast<VkPipelineMultisampleStateCreateInfo &>(*info->pMultisampleState);
		if (dynamic_info.sample_mask)
			ms.pSampleMask = nullptr;

		// If rasterizationSamples is dynamic, but not sample mask,
		// rasterizationSamples still provides the size of the sample mask array.
		if (ms.pSampleMask)
			ms.pSampleMask = copy(ms.pSampleMask, (ms.rasterizationSamples + 31) / 32, alloc);
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, &dynamic_info, state_flags))
		return false;

	*out_create_info = info;
	return true;
}